

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

void MemoryProfiler::AccumulateData
               (ArenaMemoryDataSummary *arenaMemoryDataSummary,ArenaMemoryData *memoryData,
               bool reset)

{
  unsigned_long *puVar1;
  bool reset_local;
  ArenaMemoryData *memoryData_local;
  ArenaMemoryDataSummary *arenaMemoryDataSummary_local;
  
  (arenaMemoryDataSummary->total).alignmentBytes =
       memoryData->alignmentBytes + (arenaMemoryDataSummary->total).alignmentBytes;
  (arenaMemoryDataSummary->total).allocatedBytes =
       memoryData->allocatedBytes + (arenaMemoryDataSummary->total).allocatedBytes;
  (arenaMemoryDataSummary->total).freelistBytes =
       memoryData->freelistBytes + (arenaMemoryDataSummary->total).freelistBytes;
  (arenaMemoryDataSummary->total).freelistCount =
       memoryData->freelistCount + (arenaMemoryDataSummary->total).freelistCount;
  (arenaMemoryDataSummary->total).requestBytes =
       memoryData->requestBytes + (arenaMemoryDataSummary->total).requestBytes;
  (arenaMemoryDataSummary->total).requestCount =
       memoryData->requestCount + (arenaMemoryDataSummary->total).requestCount;
  (arenaMemoryDataSummary->total).reuseCount =
       memoryData->reuseCount + (arenaMemoryDataSummary->total).reuseCount;
  (arenaMemoryDataSummary->total).reuseBytes =
       memoryData->reuseBytes + (arenaMemoryDataSummary->total).reuseBytes;
  if (!reset) {
    (arenaMemoryDataSummary->total).resetCount =
         memoryData->resetCount + (arenaMemoryDataSummary->total).resetCount;
  }
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).alignmentBytes,
                              &memoryData->alignmentBytes);
  (arenaMemoryDataSummary->max).alignmentBytes = *puVar1;
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).allocatedBytes,
                              &memoryData->allocatedBytes);
  (arenaMemoryDataSummary->max).allocatedBytes = *puVar1;
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).freelistBytes,
                              &memoryData->freelistBytes);
  (arenaMemoryDataSummary->max).freelistBytes = *puVar1;
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).freelistCount,
                              &memoryData->freelistCount);
  (arenaMemoryDataSummary->max).freelistCount = *puVar1;
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).requestBytes,&memoryData->requestBytes)
  ;
  (arenaMemoryDataSummary->max).requestBytes = *puVar1;
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).requestCount,&memoryData->requestCount)
  ;
  (arenaMemoryDataSummary->max).requestCount = *puVar1;
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).reuseCount,&memoryData->reuseCount);
  (arenaMemoryDataSummary->max).reuseCount = *puVar1;
  puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).reuseBytes,&memoryData->reuseBytes);
  (arenaMemoryDataSummary->max).reuseBytes = *puVar1;
  if (!reset) {
    puVar1 = max<unsigned_long>(&(arenaMemoryDataSummary->max).resetCount,&memoryData->resetCount);
    (arenaMemoryDataSummary->max).resetCount = *puVar1;
  }
  return;
}

Assistant:

void
MemoryProfiler::AccumulateData(ArenaMemoryDataSummary * arenaMemoryDataSummary,  ArenaMemoryData * memoryData, bool reset)
{
    arenaMemoryDataSummary->total.alignmentBytes += memoryData->alignmentBytes;
    arenaMemoryDataSummary->total.allocatedBytes += memoryData->allocatedBytes;
    arenaMemoryDataSummary->total.freelistBytes += memoryData->freelistBytes;
    arenaMemoryDataSummary->total.freelistCount += memoryData->freelistCount;
    arenaMemoryDataSummary->total.requestBytes += memoryData->requestBytes;
    arenaMemoryDataSummary->total.requestCount += memoryData->requestCount;
    arenaMemoryDataSummary->total.reuseCount += memoryData->reuseCount;
    arenaMemoryDataSummary->total.reuseBytes += memoryData->reuseBytes;
    if (!reset)
    {
        arenaMemoryDataSummary->total.resetCount += memoryData->resetCount;
    }

    arenaMemoryDataSummary->max.alignmentBytes = max(arenaMemoryDataSummary->max.alignmentBytes, memoryData->alignmentBytes);
    arenaMemoryDataSummary->max.allocatedBytes = max(arenaMemoryDataSummary->max.allocatedBytes, memoryData->allocatedBytes);
    arenaMemoryDataSummary->max.freelistBytes = max(arenaMemoryDataSummary->max.freelistBytes, memoryData->freelistBytes);
    arenaMemoryDataSummary->max.freelistCount = max(arenaMemoryDataSummary->max.freelistCount, memoryData->freelistCount);
    arenaMemoryDataSummary->max.requestBytes = max(arenaMemoryDataSummary->max.requestBytes, memoryData->requestBytes);
    arenaMemoryDataSummary->max.requestCount = max(arenaMemoryDataSummary->max.requestCount, memoryData->requestCount);
    arenaMemoryDataSummary->max.reuseCount = max(arenaMemoryDataSummary->max.reuseCount, memoryData->reuseCount);
    arenaMemoryDataSummary->max.reuseBytes = max(arenaMemoryDataSummary->max.reuseBytes, memoryData->reuseBytes);
    if (!reset)
    {
        arenaMemoryDataSummary->max.resetCount = max(arenaMemoryDataSummary->max.resetCount, memoryData->resetCount);
    }
}